

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestInstallerTest.cpp
# Opt level: O3

void __thiscall
TEST_GROUP_CppUTestGroupTestInstaller::~TEST_GROUP_CppUTestGroupTestInstaller
          (TEST_GROUP_CppUTestGroupTestInstaller *this)

{
  (this->super_Utest)._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupTestInstaller_00384fb0;
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)&this->shell);
  Utest::~Utest(&this->super_Utest);
  operator_delete(this,0x50);
  return;
}

Assistant:

TEST_GROUP(TestInstaller)
{
    TestInstaller* testInstaller;
    TestRegistry* myRegistry;
    TestInstallerTestUtestShell shell;
    void setup() _override
    {
        myRegistry = new TestRegistry();
        myRegistry->setCurrentRegistry(myRegistry);
        testInstaller = new TestInstaller(shell, "TestInstaller", "test", __FILE__, __LINE__);
    }
    void teardown() _override
    {
        myRegistry->setCurrentRegistry(NULLPTR);
        testInstaller->unDo();
        delete testInstaller;
        delete myRegistry;
    }
}